

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O0

double exp_bounded(double v)

{
  double in_XMM0_Qa;
  undefined8 local_8;
  
  if (in_XMM0_Qa <= 700.0) {
    if (-700.0 <= in_XMM0_Qa) {
      local_8 = exp(in_XMM0_Qa);
    }
    else {
      local_8 = 0.0;
    }
  }
  else {
    local_8 = 1.79769313486232e+308;
  }
  return local_8;
}

Assistant:

static inline double exp_bounded(double v) {
  // When v > 700 or <-700, the exp function will be close to overflow
  // For details, see the "Notes" in the following link.
  // https://en.cppreference.com/w/c/numeric/math/exp
  if (v > 700) {
    return DBL_MAX;
  } else if (v < -700) {
    return 0;
  }
  return exp(v);
}